

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationZZ<std::complex<double>_>::matrix(RotationZZ<std::complex<double>_> *this)

{
  complex<double> m02;
  complex<double> m03;
  complex<double> m10;
  complex<double> m11;
  complex<double> m12;
  complex<double> m13;
  complex<double> m20;
  complex<double> m21;
  complex<double> m22;
  complex<double> m23;
  complex<double> m30;
  complex<double> m31;
  complex<double> m32;
  complex<double> m33;
  data_type extraout_RDX;
  QRotationGate2<std::complex<double>_> *in_RSI;
  double in_XMM0_Qa;
  double __x;
  double dVar1;
  double __x_00;
  double __i;
  SquareMatrix<std::complex<double>_> SVar2;
  complex<double> m00;
  complex<double> m01;
  SquareMatrix<std::complex<double>_> *this_00;
  complex<double> local_150;
  complex<double> local_140;
  complex<double> local_130;
  complex<double> local_120 [2];
  complex<double> local_100;
  complex<double> local_f0;
  complex<double> local_e0;
  complex<double> local_d0 [2];
  complex<double> local_b0;
  complex<double> local_a0;
  complex<double> local_90;
  complex<double> local_80 [2];
  undefined1 local_60 [8];
  complex<double> b;
  complex<double> a;
  RotationZZ<std::complex<double>_> *this_local;
  
  this_00 = (SquareMatrix<std::complex<double>_> *)this;
  __x = QRotationGate2<std::complex<double>_>::cos(in_RSI,in_XMM0_Qa);
  dVar1 = QRotationGate2<std::complex<double>_>::sin(in_RSI,__x);
  std::complex<double>::complex((complex<double> *)(b._M_value + 8),__x,-dVar1);
  dVar1 = QRotationGate2<std::complex<double>_>::cos(in_RSI,__x_00);
  __i = QRotationGate2<std::complex<double>_>::sin(in_RSI,dVar1);
  std::complex<double>::complex((complex<double> *)local_60,dVar1,__i);
  local_80[1]._M_value._0_8_ = b._M_value._8_8_;
  std::complex<double>::complex(local_80,0.0,0.0);
  std::complex<double>::complex(&local_90,0.0,0.0);
  std::complex<double>::complex(&local_a0,0.0,0.0);
  std::complex<double>::complex(&local_b0,0.0,0.0);
  local_d0[1]._M_value._0_8_ = local_60;
  local_d0[1]._M_value._8_8_ = b._M_value._0_8_;
  std::complex<double>::complex(local_d0,0.0,0.0);
  std::complex<double>::complex(&local_e0,0.0,0.0);
  std::complex<double>::complex(&local_f0,0.0,0.0);
  std::complex<double>::complex(&local_100,0.0,0.0);
  local_120[1]._M_value._0_8_ = local_60;
  local_120[1]._M_value._8_8_ = b._M_value._0_8_;
  std::complex<double>::complex(local_120,0.0,0.0);
  std::complex<double>::complex(&local_130,0.0,0.0);
  std::complex<double>::complex(&local_140,0.0,0.0);
  std::complex<double>::complex(&local_150,0.0,0.0);
  m02._M_value._8_8_ = local_b0._M_value._8_8_;
  m02._M_value._0_8_ = local_b0._M_value._0_8_;
  m03._M_value._8_8_ = local_d0[1]._M_value._8_8_;
  m03._M_value._0_8_ = local_d0[1]._M_value._0_8_;
  m10._M_value._8_8_ = local_d0[0]._M_value._8_8_;
  m10._M_value._0_8_ = local_d0[0]._M_value._0_8_;
  m11._M_value._8_8_ = local_e0._M_value._8_8_;
  m11._M_value._0_8_ = local_e0._M_value._0_8_;
  m12._M_value._8_8_ = local_f0._M_value._8_8_;
  m12._M_value._0_8_ = local_f0._M_value._0_8_;
  m13._M_value._8_8_ = local_100._M_value._8_8_;
  m13._M_value._0_8_ = local_100._M_value._0_8_;
  m20._M_value._8_8_ = local_120[1]._M_value._8_8_;
  m20._M_value._0_8_ = local_120[1]._M_value._0_8_;
  m21._M_value._8_8_ = local_120[0]._M_value._8_8_;
  m21._M_value._0_8_ = local_120[0]._M_value._0_8_;
  m22._M_value._8_8_ = local_130._M_value._8_8_;
  m22._M_value._0_8_ = local_130._M_value._0_8_;
  m23._M_value._8_8_ = local_140._M_value._8_8_;
  m23._M_value._0_8_ = local_140._M_value._0_8_;
  m30._M_value._8_8_ = local_150._M_value._8_8_;
  m30._M_value._0_8_ = local_150._M_value._0_8_;
  m31._M_value._8_8_ = a._M_value._0_8_;
  m31._M_value._0_8_ = b._M_value._8_8_;
  m32._M_value._8_8_ = in_RSI;
  m32._M_value._0_8_ = __x;
  m33._M_value._8_8_ = this_00;
  m33._M_value._0_8_ = dVar1;
  m00._M_value._8_8_ = local_150._M_value._0_8_;
  m00._M_value._0_8_ = local_140._M_value._0_8_;
  m01._M_value._8_8_ = local_130._M_value._0_8_;
  m01._M_value._0_8_ = b._M_value._8_8_;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (this_00,m00,m01,m02,m03,m10,m11,m12,m13,m20,m21,m22,m23,m30,m31,m32,m33);
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T a = T(this->cos(),-this->sin()) ;
          const T b = T(this->cos(), this->sin()) ;
          return qclab::dense::SquareMatrix< T >( a , 0 , 0 , 0 ,
                                                  0 , b , 0 , 0 ,
                                                  0 , 0 , b , 0 ,
                                                  0 , 0 , 0 , a ) ;
        }